

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

void __thiscall
dg::llvmdg::LazyLLVMCallGraph::processBBlock
          (LazyLLVMCallGraph *this,Function *parent,BasicBlock *B,
          SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *queue)

{
  bool bVar1;
  Value *pVVar2;
  const_iterator CI;
  const_iterator cVar3;
  ret_type pFVar4;
  LazyLLVMCallGraph *in_RDI;
  LLVMPointer LVar5;
  Function *F;
  LLVMPointer *ptr;
  const_iterator __end4;
  const_iterator __begin4;
  LLVMPointsToSet *__range4;
  LLVMPointsToSet pts;
  CallInst *C;
  Instruction *I;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlock *__range2;
  BasicBlock *in_stack_ffffffffffffff68;
  LLVMPointerAnalysis *C_00;
  Offset a;
  SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *this_00;
  Function *F_00;
  Function local_50 [8];
  ret_type local_48;
  reference local_40;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_38;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_30 [6];
  
  local_30[0].NodePtr = (node_pointer)llvm::BasicBlock::begin(in_stack_ffffffffffffff68);
  local_38.NodePtr = (node_pointer)llvm::BasicBlock::end(in_stack_ffffffffffffff68);
  while (bVar1 = llvm::operator!=(local_30,&local_38), bVar1) {
    local_40 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                            *)0x18e4de);
    local_48 = llvm::dyn_cast<llvm::CallInst,llvm::Instruction_const>((Instruction *)in_RDI);
    if (local_48 != (ret_type)0x0) {
      C_00 = in_RDI->_pta;
      pVVar2 = _getCalledValue(in_RDI,(CallInst *)C_00);
      (*C_00->_vptr_LLVMPointerAnalysis[1])(local_50,C_00,pVVar2);
      F_00 = local_50;
      CI = LLVMPointsToSet::begin((LLVMPointsToSet *)C_00);
      cVar3 = LLVMPointsToSet::end();
      while (bVar1 = LLVMPointsToSet::const_iterator::operator!=
                               ((const_iterator *)in_RDI,(const_iterator *)C_00), bVar1) {
        LVar5 = LLVMPointsToSet::const_iterator::operator*((const_iterator *)0x18e56c);
        this_00 = (SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *)&stack0xffffffffffffff80;
        pFVar4 = llvm::dyn_cast<llvm::Function,llvm::Value>((Value *)in_RDI);
        if (pFVar4 != (ret_type)0x0) {
          bVar1 = anon_unknown_2::callIsCompatible
                            (F_00,(CallInst *)CI.impl,(CallCompatibility)((ulong)cVar3.impl >> 0x20)
                            );
          a = LVar5.offset.offset;
          if (bVar1) {
            GenericCallGraph<const_llvm::Function_*>::addCall
                      ((GenericCallGraph<const_llvm::Function_*> *)this_00,(Function **)a.offset,
                       (Function **)LVar5.value);
            ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::push
                      (this_00,(ValueType *)a.offset);
          }
        }
        LLVMPointsToSet::const_iterator::operator++((const_iterator *)in_RDI);
      }
      LLVMPointsToSet::~LLVMPointsToSet((LLVMPointsToSet *)0x18e5fb);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                  *)in_RDI);
  }
  return;
}

Assistant:

void
    processBBlock(const llvm::Function *parent, const llvm::BasicBlock &B,
                  ADT::SetQueue<QueueFIFO<const llvm::Function *>> &queue) {
        assert(_pta && "This method can be used only with PTA");
        for (auto &I : B) {
            if (auto *C = llvm::dyn_cast<llvm::CallInst>(&I)) {
                auto pts = _pta->getLLVMPointsTo(_getCalledValue(C));
                for (const auto &ptr : pts) {
                    if (auto *F = llvm::dyn_cast<llvm::Function>(ptr.value)) {
                        if (callIsCompatible(F, C)) {
                            _cg.addCall(parent, F);
                            queue.push(F);
                        }
                    }
                }
            }
        }
    }